

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O0

bool __thiscall
squall::TableBase::get<std::__cxx11::string>
          (TableBase *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r)

{
  HSQOBJECT obj;
  HSQUIRRELVM v;
  SQRESULT SVar1;
  SQChar *pSVar2;
  HSQUIRRELVM nelemstopop;
  string_wrapper local_40;
  undefined8 local_38;
  HSQUIRRELVM v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r_local;
  string *name_local;
  TableBase *this_local;
  
  local_38 = *(undefined8 *)&this->tableobj_;
  v_00 = (HSQUIRRELVM)(this->tableobj_)._unVal.pTable;
  obj._unVal.pTable = (SQTable *)name;
  obj._0_8_ = r;
  sq_pushobject(v_00,obj);
  nelemstopop = (HSQUIRRELVM)(((HSQUIRRELVM)this)->super_SQCollectable).super_SQRefCounted._uiRef;
  v = (HSQUIRRELVM)std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring((HSQUIRRELVM)name,(SQChar *)r,(SQInteger)v_00);
  SVar1 = sq_get((HSQUIRRELVM)this,(SQInteger)v);
  if (-1 < SVar1) {
    local_40.s_ = (SQChar *)
                  detail::fetch<std::__cxx11::string,(squall::detail::FetchContext)2>
                            ((HSQUIRRELVM)
                             (((HSQUIRRELVM)this)->super_SQCollectable).super_SQRefCounted._uiRef,-1
                            );
    pSVar2 = string_wrapper::operator_cast_to_char_(&local_40);
    std::__cxx11::string::operator=((string *)r,pSVar2);
    sq_pop(v,(SQInteger)nelemstopop);
  }
  return -1 < SVar1;
}

Assistant:

bool get(const string& name, T& r) {
        sq_pushobject(vm_, tableobj_);
        sq_pushstring(vm_, name.data(), name.length());
        if (!SQ_SUCCEEDED(sq_get(vm_, -2))) {
            return false;
        }
        r = detail::fetch<T, detail::FetchContext::TableEntry>(vm_, -1);
        sq_pop(vm_, 2);
        return true;
    }